

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O2

mg_path * mg_path_alloc(uint32_t node_count,uint32_t relationship_count,uint32_t sequence_length,
                       mg_allocator *allocator)

{
  mg_path *pmVar1;
  
  pmVar1 = (mg_path *)
           mg_allocator_malloc(allocator,
                               (ulong)relationship_count * 8 + (ulong)node_count * 8 +
                               (ulong)sequence_length * 8 + 0x28);
  if (pmVar1 != (mg_path *)0x0) {
    pmVar1->nodes = (mg_node **)(pmVar1 + 1);
    pmVar1->relationships =
         (mg_unbound_relationship **)(&pmVar1[1].node_count + (ulong)node_count * 2);
    pmVar1->sequence =
         (int64_t *)(&pmVar1[1].node_count + (ulong)node_count * 2 + (ulong)relationship_count * 2);
  }
  return pmVar1;
}

Assistant:

mg_path *mg_path_alloc(uint32_t node_count, uint32_t relationship_count,
                       uint32_t sequence_length, mg_allocator *allocator) {
  size_t nodes_size = node_count * sizeof(mg_node *);
  size_t relationships_size =
      relationship_count * sizeof(mg_unbound_relationship *);
  size_t sequence_size = sequence_length * sizeof(int64_t);
  char *block =
      mg_allocator_malloc(allocator, sizeof(mg_path) + nodes_size +
                                         relationships_size + sequence_size);
  if (!block) {
    return NULL;
  }
  mg_path *path = (mg_path *)block;
  path->nodes = (mg_node **)(block + sizeof(mg_path));
  path->relationships =
      (mg_unbound_relationship **)(block + sizeof(mg_path) + nodes_size);
  path->sequence =
      (int64_t *)(block + sizeof(mg_path) + nodes_size + relationships_size);
  return path;
}